

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

void SetUserVariable(AActor *self,FName *varname,int index,int value)

{
  bool bVar1;
  FName local_34;
  PType *local_30;
  PType *type;
  void *addr;
  int value_local;
  int index_local;
  FName *varname_local;
  AActor *self_local;
  
  addr._0_4_ = value;
  addr._4_4_ = index;
  _value_local = varname;
  varname_local = (FName *)self;
  FName::FName(&local_34,varname);
  bVar1 = GetVarAddrType(self,&local_34,addr._4_4_,&type,&local_30,false);
  if (bVar1) {
    bVar1 = DObject::IsKindOf((DObject *)local_30,PFloat::RegistrationInfo.MyClass);
    if (bVar1) {
      ACSToDouble((uint)addr);
      (*(local_30->super_PTypeBase).super_DObject._vptr_DObject[0x10])(local_30,type);
    }
    else {
      (*(local_30->super_PTypeBase).super_DObject._vptr_DObject[0xf])
                (local_30,type,(ulong)(uint)addr);
    }
  }
  return;
}

Assistant:

static void SetUserVariable(AActor *self, FName varname, int index, int value)
{
	void *addr;
	PType *type;

	if (GetVarAddrType(self, varname, index, addr, type, false))
	{
		if (!type->IsKindOf(RUNTIME_CLASS(PFloat)))
		{
			type->SetValue(addr, value);
		}
		else
		{
			type->SetValue(addr, ACSToDouble(value));
		}
	}
}